

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

string * __thiscall
cmGlobalNinjaMultiGenerator::ExpandCFGIntDir
          (string *__return_storage_ptr__,cmGlobalNinjaMultiGenerator *this,string *str,
          string *config)

{
  int iVar1;
  undefined4 extraout_var;
  allocator<char> local_5d [13];
  string local_50;
  undefined1 local_29;
  string *local_28;
  string *config_local;
  string *str_local;
  cmGlobalNinjaMultiGenerator *this_local;
  string *result;
  
  local_29 = 0;
  local_28 = config;
  config_local = str;
  str_local = (string *)this;
  this_local = (cmGlobalNinjaMultiGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  iVar1 = (*(this->super_cmGlobalNinjaGenerator).super_cmGlobalCommonGenerator.
            super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x15])();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,(char *)CONCAT44(extraout_var,iVar1),local_5d);
  cmsys::SystemTools::ReplaceString(__return_storage_ptr__,&local_50,local_28);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(local_5d);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaMultiGenerator::ExpandCFGIntDir(
  const std::string& str, const std::string& config) const
{
  std::string result = str;
  cmSystemTools::ReplaceString(result, this->GetCMakeCFGIntDir(), config);
  return result;
}